

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O0

RC __thiscall SM_Manager::CloseDb(SM_Manager *this)

{
  RC rc;
  SM_Manager *this_local;
  
  this_local._4_4_ = RM_Manager::CloseFile(this->rmm,&this->relcatFH);
  if ((this_local._4_4_ == 0) &&
     (this_local._4_4_ = RM_Manager::CloseFile(this->rmm,&this->attrcatFH), this_local._4_4_ == 0))
  {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

RC SM_Manager::CloseDb()
{
  
  RC rc = 0;
  if((rc = rmm.CloseFile(relcatFH) )){
    return (rc);
  }
  if((rc = rmm.CloseFile(attrcatFH))){
    return (rc);
  } 
  
  return (0);
}